

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cc
# Opt level: O2

void __thiscall muduo::LogFile::append(LogFile *this,char *logline,int len)

{
  MutexLockGuard lock;
  _Head_base<0UL,_muduo::MutexLock_*,_false> local_20;
  
  local_20._M_head_impl =
       (this->mutex_)._M_t.
       super___uniq_ptr_impl<muduo::MutexLock,_std::default_delete<muduo::MutexLock>_>._M_t.
       super__Tuple_impl<0UL,_muduo::MutexLock_*,_std::default_delete<muduo::MutexLock>_>.
       super__Head_base<0UL,_muduo::MutexLock_*,_false>._M_head_impl;
  if (local_20._M_head_impl != (MutexLock *)0x0) {
    MutexLock::lock(local_20._M_head_impl);
    append_unlocked(this,logline,len);
    MutexLockGuard::~MutexLockGuard((MutexLockGuard *)&local_20);
    return;
  }
  append_unlocked(this,logline,len);
  return;
}

Assistant:

void LogFile::append(const char* logline, int len)
{
  if (mutex_)
  {
    MutexLockGuard lock(*mutex_);
    append_unlocked(logline, len);
  }
  else
  {
    append_unlocked(logline, len);
  }
}